

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Tracer.cpp
# Opt level: O0

void __thiscall helics::apps::Tracer::loadCaptureInterfaces(Tracer *this)

{
  string_view fedName;
  string_view queryres;
  bool bVar1;
  element_type *peVar2;
  long in_RDI;
  basic_string_view<char,_std::char_traits<char>_> *this_00;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *pub;
  iterator __end4;
  iterator __begin4;
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  *__range4;
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  pubs;
  bool res;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *capt;
  iterator __end2;
  iterator __begin2;
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  *__range2;
  undefined4 in_stack_fffffffffffffe78;
  undefined4 in_stack_fffffffffffffe7c;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *in_stack_fffffffffffffe80;
  char *in_stack_fffffffffffffe88;
  __normal_iterator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_std::vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
  local_118;
  Tracer *this_01;
  string_view in_stack_fffffffffffffef8;
  __sv_type in_stack_ffffffffffffff48;
  milliseconds in_stack_ffffffffffffff58;
  element_type *in_stack_ffffffffffffff60;
  __shared_count<(__gnu_cxx::_Lock_policy)2> in_stack_ffffffffffffff68;
  string_view in_stack_ffffffffffffff70;
  string_view in_stack_ffffffffffffff80;
  HelicsSequencingModes in_stack_ffffffffffffffa0;
  undefined1 in_stack_ffffffffffffffa4 [12];
  undefined4 local_4c;
  __sv_type local_40;
  undefined1 local_29;
  reference local_28;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *local_20;
  __normal_iterator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_std::vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
  local_18;
  pointer local_10;
  
  local_10 = (pointer)(in_RDI + 0x1b8);
  local_18._M_current =
       (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
       CLI::std::
       vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
       ::begin((vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                *)CONCAT44(in_stack_fffffffffffffe7c,in_stack_fffffffffffffe78));
  local_20 = (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
             CLI::std::
             vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
             ::end((vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                    *)CONCAT44(in_stack_fffffffffffffe7c,in_stack_fffffffffffffe78));
  while (bVar1 = __gnu_cxx::
                 operator==<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_std::vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
                           ((__normal_iterator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_std::vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
                             *)in_stack_fffffffffffffe80,
                            (__normal_iterator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_std::vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
                             *)CONCAT44(in_stack_fffffffffffffe7c,in_stack_fffffffffffffe78)),
        ((bVar1 ^ 0xffU) & 1) != 0) {
    local_28 = __gnu_cxx::
               __normal_iterator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_std::vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
               ::operator*(&local_18);
    CLI::std::__shared_ptr<helics::CombinationFederate,_(__gnu_cxx::_Lock_policy)2>::get
              ((__shared_ptr<helics::CombinationFederate,_(__gnu_cxx::_Lock_policy)2> *)(in_RDI + 8)
              );
    local_40 = std::__cxx11::string::operator_cast_to_basic_string_view(in_stack_fffffffffffffe80);
    local_4c = 10000;
    std::chrono::duration<long,std::ratio<1l,1000l>>::duration<int,void>
              ((duration<long,std::ratio<1l,1000l>> *)&stack0xffffffffffffffb8,
               &stack0xffffffffffffffb4);
    fedName._M_str = (char *)in_stack_ffffffffffffff68._M_pi;
    fedName._M_len = (size_t)in_stack_ffffffffffffff60;
    local_29 = waitForInit((Federate *)in_stack_ffffffffffffff48._M_str,fedName,
                           in_stack_ffffffffffffff58);
    if ((bool)local_29) {
      this_00 = (basic_string_view<char,_std::char_traits<char>_> *)(in_RDI + 8);
      peVar2 = CLI::std::
               __shared_ptr_access<helics::CombinationFederate,_(__gnu_cxx::_Lock_policy)2,_false,_false>
               ::operator->((__shared_ptr_access<helics::CombinationFederate,_(__gnu_cxx::_Lock_policy)2,_false,_false>
                             *)0x245260);
      in_stack_fffffffffffffe80 =
           (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
           ((long)&(peVar2->super_ValueFederate)._vptr_ValueFederate +
           (long)(peVar2->super_ValueFederate)._vptr_ValueFederate[-3]);
      CLI::std::basic_string_view<char,_std::char_traits<char>_>::basic_string_view
                (this_00,in_stack_fffffffffffffe88);
      CLI::std::basic_string_view<char,_std::char_traits<char>_>::basic_string_view
                (this_00,in_stack_fffffffffffffe88);
      in_stack_fffffffffffffe88 = &stack0xffffffffffffff90;
      Federate::query_abi_cxx11_
                ((Federate *)in_stack_ffffffffffffff68._M_pi,in_stack_ffffffffffffff80,
                 in_stack_ffffffffffffff70,in_stack_ffffffffffffffa0);
      std::__cxx11::string::~string(in_stack_fffffffffffffe80);
      CLI::std::
      __shared_ptr_access<helics::CombinationFederate,_(__gnu_cxx::_Lock_policy)2,_false,_false>::
      operator->((__shared_ptr_access<helics::CombinationFederate,_(__gnu_cxx::_Lock_policy)2,_false,_false>
                  *)0x2452eb);
      std::__cxx11::string::operator_cast_to_basic_string_view(in_stack_fffffffffffffe80);
      CLI::std::basic_string_view<char,_std::char_traits<char>_>::basic_string_view
                (this_00,in_stack_fffffffffffffe88);
      in_stack_fffffffffffffe78 = 1;
      Federate::query_abi_cxx11_
                ((Federate *)in_stack_ffffffffffffff68._M_pi,in_stack_ffffffffffffff80,
                 in_stack_ffffffffffffff70,in_stack_ffffffffffffffa0);
      in_stack_ffffffffffffff48 =
           std::__cxx11::string::operator_cast_to_basic_string_view(in_stack_fffffffffffffe80);
      queryres._4_12_ = in_stack_ffffffffffffffa4;
      queryres._M_len._0_4_ = in_stack_ffffffffffffffa0;
      vectorizeQueryResult_abi_cxx11_(queryres);
      std::__cxx11::string::~string(in_stack_fffffffffffffe80);
      this_01 = (Tracer *)&stack0xffffffffffffff58;
      local_118._M_current =
           (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
           CLI::std::
           vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
           ::begin((vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                    *)CONCAT44(in_stack_fffffffffffffe7c,in_stack_fffffffffffffe78));
      CLI::std::
      vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
      ::end((vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
             *)CONCAT44(in_stack_fffffffffffffe7c,in_stack_fffffffffffffe78));
      while (bVar1 = __gnu_cxx::
                     operator==<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_std::vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
                               ((__normal_iterator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_std::vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
                                 *)in_stack_fffffffffffffe80,
                                (__normal_iterator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_std::vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
                                 *)CONCAT44(in_stack_fffffffffffffe7c,in_stack_fffffffffffffe78)),
            ((bVar1 ^ 0xffU) & 1) != 0) {
        __gnu_cxx::
        __normal_iterator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_std::vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
        ::operator*(&local_118);
        std::__cxx11::string::operator_cast_to_basic_string_view(in_stack_fffffffffffffe80);
        addSubscription(this_01,in_stack_fffffffffffffef8);
        __gnu_cxx::
        __normal_iterator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_std::vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
        ::operator++(&local_118);
      }
      CLI::std::
      vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
      ::~vector((vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                 *)this_00);
    }
    __gnu_cxx::
    __normal_iterator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_std::vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
    ::operator++(&local_18);
  }
  return;
}

Assistant:

void Tracer::loadCaptureInterfaces()
{
    for (auto& capt : captureInterfaces) {
        auto res = waitForInit(fed.get(), capt);
        if (res) {
            fed->query("root", "global_flush", HELICS_SEQUENCING_MODE_ORDERED);
            auto pubs = vectorizeQueryResult(
                fed->query(capt, "publications", HELICS_SEQUENCING_MODE_ORDERED));
            for (auto& pub : pubs) {
                addSubscription(pub);
            }
        }
    }
}